

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_flip(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  uint8_t uVar4;
  _Bool _Var5;
  uint16_t hb;
  uint uVar6;
  int iVar7;
  roaring_array_t *ra;
  roaring_bitmap_t *prVar8;
  run_container_t *run;
  run_container_t *c;
  uint8_t uVar9;
  uint uVar10;
  array_container_t *src;
  uint16_t lb_start;
  uint uVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ushort uVar15;
  bool bVar16;
  run_container_t *local_48;
  ulong local_40;
  uint local_34;
  
  if (range_end <= range_start) {
    prVar8 = roaring_bitmap_copy(x1);
    return prVar8;
  }
  uVar13 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar13 = range_end;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar14 = uVar13 - 1;
  uVar15 = (ushort)(range_start >> 0x10);
  local_40 = uVar14;
  ra_append_copies_until
            (ra,&x1->high_low_container,uVar15,(_Bool)((x1->high_low_container).flags & 1));
  hb = (uint16_t)(uVar14 >> 0x10);
  lb_start = (uint16_t)range_start;
  if (hb == uVar15) {
    insert_flipped_container(ra,&x1->high_low_container,uVar15,lb_start,(uint16_t)uVar14);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,uVar15,lb_start,0xffff);
      uVar15 = uVar15 + 1;
    }
    local_40 = local_40 & 0xffff;
    uVar10 = ((uint)(uVar14 >> 0x10) & 0xffff) - (uint)(local_40 != 0xffff);
    if (uVar15 <= (ushort)uVar10) {
      local_34 = uVar10 & 0xffff;
      uVar10 = (uint)uVar15;
      do {
        iVar7 = (x1->high_low_container).size;
        uVar15 = (ushort)uVar10;
        if (((long)iVar7 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar7 + -1] == uVar15)) {
          uVar6 = iVar7 - 1;
        }
        else if (iVar7 < 1) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar7 = iVar7 + -1;
          uVar11 = 0;
          do {
            uVar6 = iVar7 + uVar11 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar11 & 0xfffffffe));
            if (uVar1 < uVar15) {
              uVar11 = uVar6 + 1;
            }
            else {
              if (uVar1 <= uVar15) goto LAB_00108024;
              iVar7 = uVar6 - 1;
            }
          } while ((int)uVar11 <= iVar7);
          uVar6 = ~uVar11;
        }
LAB_00108024:
        iVar7 = ra->size;
        if (((long)iVar7 == 0) || (ra->keys[(long)iVar7 + -1] == uVar15)) {
          uVar11 = iVar7 - 1;
        }
        else if (iVar7 < 1) {
          uVar11 = 0xffffffff;
        }
        else {
          iVar7 = iVar7 + -1;
          uVar12 = 0;
          do {
            uVar11 = iVar7 + uVar12 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(iVar7 + uVar12 & 0xfffffffe));
            if (uVar1 < uVar15) {
              uVar12 = uVar11 + 1;
            }
            else {
              if (uVar1 <= uVar15) goto LAB_0010803f;
              iVar7 = uVar11 - 1;
            }
          } while ((int)uVar12 <= iVar7);
          uVar11 = ~uVar12;
        }
LAB_0010803f:
        if ((int)uVar6 < 0) {
          c = run_container_create_given_capacity(1);
          if (c != (run_container_t *)0x0) {
            prVar3 = c->runs;
            iVar7 = c->n_runs;
            prVar3[iVar7].value = 0;
            prVar3[iVar7].length = 0xffff;
            c->n_runs = c->n_runs + 1;
          }
          uVar4 = '\x03';
LAB_001081c5:
          ra_insert_new_key_value_at(ra,~uVar11,uVar15,c,uVar4);
        }
        else {
          uVar4 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar6 & 0xffff];
          if (uVar4 == '\x04') {
            uVar4 = *(uint8_t *)&src->array;
            src = *(array_container_t **)src;
          }
          local_48 = (run_container_t *)0x0;
          if (uVar4 == '\x03') {
            iVar7 = run_container_negation((run_container_t *)src,&local_48);
            uVar9 = (uint8_t)iVar7;
            run = local_48;
            c = local_48;
            uVar4 = uVar9;
            if (uVar9 == '\x04') {
              uVar9 = *(uint8_t *)&local_48->runs;
              run = *(run_container_t **)local_48;
              uVar4 = '\x04';
            }
          }
          else if (uVar4 == '\x02') {
            run = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)run);
            uVar9 = '\x01';
            c = run;
            uVar4 = uVar9;
          }
          else {
            _Var5 = bitset_container_negation((bitset_container_t *)src,&local_48);
            uVar9 = '\x02' - _Var5;
            run = local_48;
            c = local_48;
            uVar4 = uVar9;
          }
          if (uVar9 == '\x03') {
            iVar7 = run_container_cardinality(run);
          }
          else {
            iVar7 = run->n_runs;
          }
          if (iVar7 != 0) goto LAB_001081c5;
          container_free(c,uVar4);
        }
        bVar16 = uVar10 != local_34;
        uVar10 = uVar10 + 1;
      } while (bVar16);
    }
    if ((int)local_40 != 0xffff) {
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)uVar14);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip(const roaring_bitmap_t *x1,
                                      uint64_t range_start,
                                      uint64_t range_end) {
    if (range_start >= range_end) {
        return roaring_bitmap_copy(x1);
    }
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}